

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingBase.cpp
# Opt level: O2

void __thiscall
MeshDenoisingBase::getAllFaceNeighbor
          (MeshDenoisingBase *this,TriMesh *mesh,
          vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
          *all_face_neighbor,FaceNeighborType face_neighbor_type,bool include_central_face)

{
  size_type __new_size;
  MeshDenoisingBase *this_00;
  FaceIter FVar1;
  undefined1 auStack_58 [8];
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> face_neighbor;
  FaceIter f_it;
  
  __new_size = (**(code **)(*(long *)&(mesh->super_Mesh).
                                      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                      .
                                      super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           + 0x28))(mesh);
  std::
  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
  ::resize(all_face_neighbor,__new_size);
  join_0x00000010_0x00000000_ = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)mesh);
  while( true ) {
    this_00 = (MeshDenoisingBase *)mesh;
    FVar1 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)mesh);
    if ((BaseHandle)f_it.mesh_._0_4_ == FVar1.hnd_.super_BaseHandle.idx_.super_BaseHandle &&
        (mesh_ptr)
        face_neighbor.
        super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage == FVar1.mesh_) break;
    auStack_58 = (undefined1  [8])0x0;
    face_neighbor.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    face_neighbor.super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    getFaceNeighbor(this_00,mesh,(FaceHandle)f_it.mesh_._0_4_,face_neighbor_type,
                    (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                    auStack_58);
    if (include_central_face) {
      std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::push_back
                ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)auStack_58,
                 (value_type *)&f_it);
    }
    std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::operator=
              ((all_face_neighbor->
               super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + f_it.mesh_._0_4_,
               (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)auStack_58);
    std::_Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::~_Vector_base
              ((_Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
               auStack_58);
    OpenMesh::Iterators::
    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
    ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                  *)&face_neighbor.
                     super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  }
  return;
}

Assistant:

void MeshDenoisingBase::getAllFaceNeighbor(TriMesh &mesh, std::vector<std::vector<TriMesh::FaceHandle> > &all_face_neighbor, FaceNeighborType face_neighbor_type, bool include_central_face)
{
    all_face_neighbor.resize(mesh.n_faces());
    for(TriMesh::FaceIter f_it = mesh.faces_begin(); f_it != mesh.faces_end(); f_it++)
    {
        std::vector<TriMesh::FaceHandle> face_neighbor;
        getFaceNeighbor(mesh, *f_it, face_neighbor_type, face_neighbor);
        if(include_central_face) face_neighbor.push_back(*f_it);
        all_face_neighbor[f_it->idx()] = face_neighbor;
    }
}